

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O0

float __thiscall
NeuralNetwork::test(NeuralNetwork *this,
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *test_xs,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            *test_ys)

{
  size_type sVar1;
  size_type sVar2;
  NeuralNetwork *this_00;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RDX;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_RSI;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  *in_RDI;
  float fVar3;
  Index realMaxRow;
  Index predMaxRow;
  int i_2;
  int i_1;
  int i;
  ssize_t correctCount;
  ssize_t testDataSize;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  yvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  xvecs;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *this_01;
  size_type local_b0;
  size_type in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar4;
  NeuralNetwork *in_stack_ffffffffffffff68;
  int local_84;
  int local_6c;
  VectorXf *x;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_58;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_30;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_18;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(in_RSI);
  sVar2 = std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::size(local_18);
  if (sVar1 == sVar2) {
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)0x1465cb);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::size(local_10);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::reserve((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              in_stack_ffffffffffffff58);
    this_01 = (DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_58;
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::vector((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)0x1465f9);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::size(local_18);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::reserve((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              in_stack_ffffffffffffff58);
    this_00 = (NeuralNetwork *)
              std::
              vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ::size(local_10);
    x = (VectorXf *)0x0;
    for (local_6c = 0; (long)local_6c < (long)this_00; local_6c = local_6c + 1) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](local_10,(long)local_6c);
      stdVecToEigenVec(in_stack_ffffffffffffff68,
                       (vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   *)this_01,
                  (value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x14668c);
    }
    for (local_84 = 0; (long)local_84 < (long)this_00; local_84 = local_84 + 1) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::operator[](local_18,(long)local_84);
      stdVecToEigenVec(in_stack_ffffffffffffff68,
                       (vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::push_back((vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                   *)this_01,
                  (value_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)0x146746);
    }
    for (iVar4 = 0; (long)iVar4 < (long)this_00; iVar4 = iVar4 + 1) {
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::operator[](&local_30,(long)iVar4);
      forwardPropagation(this_00,x);
      std::vector<Layer,_std::allocator<Layer>_>::back
                ((vector<Layer,_std::allocator<Layer>_> *)this_01);
      Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::maxCoeff<long>
                (this_01,(long *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::
      vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
      ::operator[](&local_58,(long)iVar4);
      Eigen::DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::maxCoeff<long>
                (this_01,(long *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (in_stack_ffffffffffffff58 == local_b0) {
        x = (VectorXf *)
            ((long)&(x->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data + 1);
      }
    }
    fVar3 = (float)(long)x / (float)(long)this_00;
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(in_RDI);
    std::
    vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(in_RDI);
    return fVar3;
  }
  __assert_fail("test_xs.size() == test_ys.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/neural_network.cpp"
                ,0xa0,
                "float NeuralNetwork::test(std::vector<std::vector<float>> &, std::vector<std::vector<float>> &)"
               );
}

Assistant:

float NeuralNetwork::test(std::vector<std::vector<float>>& test_xs,
                          std::vector<std::vector<float>>& test_ys) {
    using namespace std;
    using namespace Eigen;
    assert(test_xs.size() == test_ys.size());
    vector<VectorXf> xvecs;
    xvecs.reserve(test_xs.size());
    vector<VectorXf> yvecs;
    yvecs.reserve(test_ys.size());

    ssize_t testDataSize = test_xs.size();
    ssize_t correctCount = 0;
    for (int i = 0; i < testDataSize; ++i) {
        xvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_xs[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        yvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_ys[i]));
    }

    for (int i = 0; i < testDataSize; ++i) {
        this->forwardPropagation(xvecs[i]);
        VectorXf::Index predMaxRow, realMaxRow;
        this->layers_.back().output.maxCoeff(&predMaxRow);
        yvecs[i].maxCoeff(&realMaxRow);
        if (predMaxRow == realMaxRow) {
            correctCount++;
        }
    }
    // cout << correctCount << endl;
    return float(correctCount) / float(testDataSize);
}